

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135> *this)

{
  code *local_680;
  undefined1 local_650 [8];
  CATCH2_INTERNAL_TEST_135 obj;
  TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135> *this_local;
  
  obj.super_initiatorFIX40Fixture.super_sessionFIX40Fixture._1592_8_ = this;
  anon_unknown.dwarf_2926b4::CATCH2_INTERNAL_TEST_135::CATCH2_INTERNAL_TEST_135
            ((CATCH2_INTERNAL_TEST_135 *)local_650);
  local_680 = (code *)this->m_testAsMethod;
  if (((ulong)local_680 & 1) != 0) {
    local_680 = *(code **)(local_680 + *(long *)(local_650 + *(long *)&this->field_0x10) + -1);
  }
  (*local_680)(local_650 + *(long *)&this->field_0x10);
  anon_unknown.dwarf_2926b4::CATCH2_INTERNAL_TEST_135::~CATCH2_INTERNAL_TEST_135
            ((CATCH2_INTERNAL_TEST_135 *)local_650);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }